

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined8 uVar2;
  sqlite3 *db;
  char *pcVar3;
  undefined4 in_register_0000000c;
  undefined8 in_XMM0_Qa;
  int status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 uVar5;
  allocator in_stack_ffffffffffffff2f;
  Logic_error *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff4c;
  
  iVar1 = sqlite3_bind_double(in_XMM0_Qa,this->stmt_,__fd,__addr,
                              CONCAT44(in_register_0000000c,__len));
  if (iVar1 != 0) {
    uVar5 = 1;
    uVar2 = __cxa_allocate_exception(0x48);
    std::__cxx11::to_string(in_stack_ffffffffffffff4c);
    std::operator+((char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::operator+(in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00);
    db = (sqlite3 *)sqlite3_errmsg(this->db_);
    std::operator+(in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00);
    pcVar3 = (char *)sqlite3_sql(this->stmt_);
    paVar4 = (allocator *)&stack0xffffffffffffff2f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff30,pcVar3,paVar4);
    Logic_error::Logic_error
              (in_stack_ffffffffffffff30,
               (string *)
               CONCAT17(in_stack_ffffffffffffff2f,CONCAT16(uVar5,in_stack_ffffffffffffff28)),
               (string *)this,(int)((ulong)uVar2 >> 0x20),db);
    __cxa_throw(uVar2,&Logic_error::typeinfo,Logic_error::~Logic_error);
  }
  return iVar1;
}

Assistant:

void Connection::Stmt::bind(const int index, const double val)
    {
        int status = sqlite3_bind_double(stmt_, index, val);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding index " +
                std::to_string(index) + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }